

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O3

uint8_t * google::protobuf::internal::
          MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)9>
          ::InternalSerialize(int field_number,int *key,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  string_view s;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar4 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar9 = (uint)uVar4;
      *ptr = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar9);
  }
  *ptr = (byte)uVar4;
  pbVar7 = ptr + 1;
  lVar3 = 0x3f;
  if (((long)*key | 1U) != 0) {
    for (; ((long)*key | 1U) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar9 = (uint)value->_M_string_length;
  uVar8 = uVar9 | 1;
  iVar2 = 0x1f;
  if (uVar8 != 0) {
    for (; uVar8 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  uVar8 = (iVar2 * 9 + 0x49U >> 6) + ((int)lVar3 * 9 + 0x49U >> 6) + uVar9 + 2;
  uVar9 = uVar8;
  if (0x7f < uVar8) {
    do {
      *pbVar7 = (byte)uVar9 | 0x80;
      uVar8 = uVar9 >> 7;
      pbVar7 = pbVar7 + 1;
      bVar1 = 0x3fff < uVar9;
      uVar9 = uVar8;
    } while (bVar1);
  }
  *pbVar7 = (byte)uVar8;
  pbVar7 = pbVar7 + 1;
  if (stream->end_ <= pbVar7) {
    pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar7);
  }
  uVar5 = (ulong)*key;
  pbVar10 = pbVar7 + 1;
  *pbVar7 = 8;
  uVar4 = uVar5;
  if (0x7f < uVar5) {
    do {
      *pbVar10 = (byte)uVar4 | 0x80;
      uVar5 = uVar4 >> 7;
      pbVar10 = pbVar10 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar5;
    } while (bVar1);
  }
  *pbVar10 = (byte)uVar5;
  pbVar10 = pbVar10 + 1;
  if (stream->end_ <= pbVar10) {
    pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar10);
  }
  __n = value->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)pbVar10)))) {
    *pbVar10 = 0x12;
    pbVar10[1] = (byte)__n;
    memcpy(pbVar10 + 2,(value->_M_dataplus)._M_p,__n);
    return pbVar10 + __n + 2;
  }
  s._M_str = (value->_M_dataplus)._M_p;
  s._M_len = __n;
  puVar6 = io::EpsCopyOutputStream::WriteStringOutline(stream,2,s,pbVar10);
  return puVar6;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }